

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O0

void TestDifficulty(uint32_t nbits,double expected_difficulty)

{
  long lVar1;
  CBlockIndex *pCVar2;
  long in_FS_OFFSET;
  uint32_t in_stack_0000000c;
  double difficulty;
  CBlockIndex *block_index;
  double in_stack_00000070;
  double in_stack_00000078;
  CBlockIndex *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = CreateBlockIndexWithNbits(in_stack_0000000c);
  GetDifficulty(in_stack_ffffffffffffffd8);
  if (pCVar2 != (CBlockIndex *)0x0) {
    operator_delete(pCVar2,0x98);
  }
  RejectDifficultyMismatch(in_stack_00000078,in_stack_00000070);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestDifficulty(uint32_t nbits, double expected_difficulty)
{
    CBlockIndex* block_index = CreateBlockIndexWithNbits(nbits);
    double difficulty = GetDifficulty(*block_index);
    delete block_index;

    RejectDifficultyMismatch(difficulty, expected_difficulty);
}